

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThread.cpp
# Opt level: O1

void __thiscall de::Thread::join(Thread *this)

{
  deBool dVar1;
  runtime_error *this_00;
  
  dVar1 = deThread_join(this->m_thread);
  if (dVar1 != 0) {
    deThread_destroy(this->m_thread);
    this->m_thread = 0;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Thread::join() failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Thread::join (void)
{
	DE_ASSERT(m_thread);
	if (!deThread_join(m_thread))
		throw std::runtime_error("Thread::join() failed");

	deThread_destroy(m_thread);
	m_thread = 0;
}